

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colList.c
# Opt level: O2

void MListInsert(Col_Word *nodePtr,size_t index,Col_Word list)

{
  byte bVar1;
  byte *list_00;
  size_t first;
  byte bVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  ulong length;
  size_t sVar6;
  Col_Word CVar7;
  ulong *mvector;
  Col_Word *pCVar8;
  size_t max;
  Col_Word CVar9;
  uint uVar10;
  MergeListChunksInfo info;
  
  sVar4 = Col_ListLength(*nodePtr);
  sVar5 = Col_ListLength(list);
  if (sVar4 == 0) {
    CVar7 = Col_CopyMList(list);
    *nodePtr = CVar7;
    return;
  }
  length = sVar5 + sVar4;
  max = sVar4 - index;
LAB_001104b1:
  mvector = (ulong *)*nodePtr;
  do {
    if (mvector == (ulong *)0x0) {
      uVar10 = 0;
    }
    else {
      if (((ulong)mvector & 0xf) == 0) {
        uVar10 = 0xffffffff;
        if (((byte)*mvector & 2) == 0) goto LAB_0011051d;
        uVar10 = (byte)*mvector & 0xfffffffe;
      }
      else {
        uVar10 = immediateWordTypes[(uint)mvector & 0x1f];
      }
      if (uVar10 == 0x1a) {
        uVar10 = 0x1a;
        if (sVar5 <= ((*mvector >> 3 & 0xffffffffffffffe0) - 0x10 >> 3) - sVar4) {
          Col_MVectorSetLength((Col_Word)mvector,length);
          memmove(mvector + index + sVar5 + 2,mvector + index + 2,max * 8);
          info.vector = *nodePtr;
          info.length = index;
          Col_TraverseListChunks(list,0,sVar5,0,MergeListChunksProc,&info,(size_t *)0x0);
          return;
        }
      }
      else if (uVar10 == 0x26) {
        sVar4 = (size_t)*(ushort *)((long)mvector + 2);
        CVar7 = mvector[2];
        if (sVar4 == 0) {
          sVar4 = Col_ListLength(CVar7);
        }
        if (index == sVar4) {
          CVar9 = *nodePtr;
          bVar1 = *(byte *)(CVar9 + 1);
          if ((bVar1 < 2) || (bVar2 = GetDepth(CVar7), bVar1 - 1 <= (uint)bVar2)) goto LAB_0011085e;
LAB_00110873:
          pCVar8 = (Col_Word *)(CVar9 + 0x10);
          sVar5 = index;
        }
        else {
LAB_0011085e:
          CVar9 = *nodePtr;
          sVar5 = index - sVar4;
          if (index < sVar4 || sVar5 == 0) goto LAB_00110873;
          pCVar8 = (Col_Word *)(CVar9 + 0x18);
        }
        MListInsert(pCVar8,sVar5,list);
        CVar7 = *nodePtr;
        goto LAB_00110883;
      }
    }
LAB_0011051d:
    if (length < 0x27) {
      CVar7 = Col_NewMVector(0,length,(Col_Word *)0x0);
      info.length = 0;
      info.vector = CVar7;
      Col_TraverseListChunks(*nodePtr,0,index,0,MergeListChunksProc,&info,(size_t *)0x0);
      Col_TraverseListChunks(list,0,sVar5,0,MergeListChunksProc,&info,(size_t *)0x0);
      Col_TraverseListChunks(*nodePtr,index,max,0,MergeListChunksProc,&info,(size_t *)0x0);
      *nodePtr = CVar7;
      return;
    }
    if (uVar10 == 0x1e) {
      if (*(byte *)((long)mvector + 1) != 0) break;
    }
    else if (uVar10 == 0x22) break;
    if ((sVar4 < index || max == 0) || index == 0) {
      CVar9 = Col_CopyMList(list);
      CVar7 = *nodePtr;
      if (index != 0) {
        CVar7 = CVar9;
        CVar9 = *nodePtr;
      }
      CVar7 = NewMConcatList(CVar9,CVar7);
      *nodePtr = CVar7;
LAB_00110883:
      UpdateMConcatNode(CVar7);
      return;
    }
    sVar6 = Col_ListLength((Col_Word)mvector);
    pCVar8 = (Col_Word *)*nodePtr;
    if (pCVar8 == (Col_Word *)0x0) {
      uVar10 = 0;
      goto LAB_001105ef;
    }
    if (((ulong)pCVar8 & 0xf) == 0) {
      if (((byte)*pCVar8 & 2) != 0) {
        uVar10 = (byte)*pCVar8 & 0xfffffffe;
        goto LAB_0011058c;
      }
LAB_001105c0:
      CVar7 = Col_Sublist((Col_Word)pCVar8,0,index - 1);
      CVar9 = Col_Sublist(*nodePtr,index,sVar6 - 1);
    }
    else {
      uVar10 = immediateWordTypes[(uint)pCVar8 & 0x1f];
LAB_0011058c:
      if (uVar10 == 0x1e) {
        list_00 = (byte *)pCVar8[1];
        uVar10 = 0x1e;
        if (list_00 == (byte *)0x0) goto LAB_001105ef;
        first = pCVar8[2];
        if (((ulong)list_00 & 0xf) == 0) {
          if ((*list_00 & 2) != 0) {
            uVar3 = *list_00 & 0xfffffffe;
            goto LAB_0011066e;
          }
        }
        else {
          uVar3 = immediateWordTypes[(uint)list_00 & 0x1f];
LAB_0011066e:
          if (uVar3 != 0xffffffff) {
            if (uVar3 == 0x16) {
              pCVar8 = (Col_Word *)(list_00 + first * 8 + 0x10);
            }
            goto LAB_001105ef;
          }
        }
        pCVar8 = (Col_Word *)Col_Sublist((Col_Word)list_00,first,(first + index) - 1);
        CVar7 = Col_Sublist(*nodePtr,first + index,(sVar6 + first) - 1);
        CVar7 = NewMConcatList((Col_Word)pCVar8,CVar7);
        *nodePtr = CVar7;
        uVar10 = 0x1e;
      }
      else {
        if (uVar10 == 0xffffffff) goto LAB_001105c0;
        if ((uVar10 == 0x16) || (uVar10 == 0x1a)) {
          pCVar8 = pCVar8 + 2;
        }
        else if (uVar10 == 0xfffffff9) {
          CVar9 = (sVar6 - index) * 0x20 | 0x14;
          CVar7 = index << 5 | 0x14;
          goto LAB_0011062c;
        }
      }
LAB_001105ef:
      CVar9 = Col_NewMVector(0,sVar6 - index,pCVar8 + index);
      if (uVar10 == 0x1a) {
        Col_MVectorSetLength(*nodePtr,index);
        CVar7 = *nodePtr;
      }
      else {
        CVar7 = Col_NewMVector(0,index,pCVar8);
      }
    }
LAB_0011062c:
    mvector = (ulong *)NewMConcatList(CVar7,CVar9);
    *nodePtr = (Col_Word)mvector;
  } while( true );
  ConvertToMConcatNode(nodePtr);
  goto LAB_001104b1;
}

Assistant:

static void
MListInsert(
    Col_Word * nodePtr, /*!< [in,out] Mutable list node to insert into. May be
                             overwritten in the process (e.g. if it gets
                             converted to mutable). */
    size_t index,       /*!< Index of insertion point. */
    Col_Word list)      /*!< List to insert. */
{
    size_t length = Col_ListLength(*nodePtr);
    size_t listLength = Col_ListLength(list);
    int type;

    ASSERT(index <= length);
    ASSERT(SIZE_MAX-length >= listLength);
    ASSERT(listLength > 0);

    if (length == 0) {
        /*
         * Replace content.
         */

        *nodePtr = Col_CopyMList(list);
        return;
    }

    /*
     * Entry point for tail recursive calls.
     */

start:

    /*
     * First try to alter mutable types if possible.
     */

    type = WORD_TYPE(*nodePtr);
    switch (type) {
    case WORD_TYPE_MCONCATLIST: {
        size_t leftLength = WORD_CONCATLIST_LEFT_LENGTH(*nodePtr);
        Col_Word left = WORD_CONCATLIST_LEFT(*nodePtr);
        if (leftLength == 0) {
            leftLength = Col_ListLength(left);
        }

        if (index == leftLength && WORD_CONCATLIST_DEPTH(*nodePtr) > 1) {
            /*
             * Insertion point is just between the two arms. Insert into
             * the shallowest one to balance tree.
             */

            if (GetDepth(left) < WORD_CONCATLIST_DEPTH(*nodePtr)-1) {
                /*
                 * Right is deeper, insert into left.
                 */

                MListInsert(&WORD_CONCATLIST_LEFT(*nodePtr), index,
                        list);
                UpdateMConcatNode(*nodePtr);
                return;
            }
        }

        if (index <= leftLength) {
            /*
             * Insert into left.
             */

            MListInsert(&WORD_CONCATLIST_LEFT(*nodePtr), index, list);
        } else {
            /*
             * Insert into right.
             */

            MListInsert(&WORD_CONCATLIST_RIGHT(*nodePtr),
                    index-leftLength, list);
        }
        UpdateMConcatNode(*nodePtr);
        return;
        }

    case WORD_TYPE_MVECTOR: {
        size_t maxLength = VECTOR_MAX_LENGTH(WORD_MVECTOR_SIZE(*nodePtr)
                * CELL_SIZE);
        Col_Word *elements = WORD_VECTOR_ELEMENTS(*nodePtr);
        if (listLength <= maxLength-length) {
            /*
             * Insert data directly into available space.
             */

            MergeListChunksInfo info;

            Col_MVectorSetLength(*nodePtr, length+listLength);

            /*
             * Move trailing elements.
             */

            memmove(elements+index+listLength, elements+index,
                    (length-index) * sizeof(*elements));

            /*
             * Copy elements from list.
             */

            info.length = index;
            info.vector = *nodePtr;
            Col_TraverseListChunks(list, 0, listLength, 0, MergeListChunksProc,
                    &info, NULL);
            ASSERT(info.length == index+listLength);
            return;
        }

        /*
         * Try other methods below.
         */

        break;
        }

    }

    if (length+listLength <= MAX_SHORT_MVECTOR_LENGTH) {
        /*
         * Merge all chunks into one mutable vector for short lists.
         * TODO: geometric growth?
         */

        MergeListChunksInfo info;

        Col_Word node = Col_NewMVector(0, length+listLength, NULL);

        info.length = 0;
        info.vector = node;
        Col_TraverseListChunks(*nodePtr, 0, index, 0, MergeListChunksProc,
                &info, NULL);
        Col_TraverseListChunks(list, 0, listLength, 0, MergeListChunksProc,
                &info, NULL);
        Col_TraverseListChunks(*nodePtr, index, length-index, 0,
                MergeListChunksProc, &info, NULL);
        ASSERT(info.length == length+listLength);

        *nodePtr = node;
        return;
    }

    /*
     * General case with immutable types and mutable with no available space.
     */

    switch (type) {
    case WORD_TYPE_CONCATLIST:
        /*
         * Convert to mutable concat then retry.
         */

        ConvertToMConcatNode(nodePtr);
        goto start;

    case WORD_TYPE_SUBLIST:
        if (WORD_SUBLIST_DEPTH(*nodePtr) >= 1) {
            /*
             * Source is concat. Convert to mutable concat then retry.
             */

            ConvertToMConcatNode(nodePtr);
            goto start;
        }
        /* continued. */
    default:
        if (index > 0 && index < length) {
            /*
             * Split at insertion point then retry.
             */

            SplitMutableAt(nodePtr, index);
            goto start;
        }

        /*
         * Build a mutable concat node with current node and list to insert.
         */

        list = Col_CopyMList(list);
        if (index == 0) {
            /*
             * Insert before.
             */

            *nodePtr = NewMConcatList(list, *nodePtr);
        } else {
            /*
             * Insert after.
             */

            ASSERT(index >= length);
            *nodePtr = NewMConcatList(*nodePtr, list);
        }
        UpdateMConcatNode(*nodePtr);
        return;
    }
}